

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main_average(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  int iVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  allocator_type local_132;
  allocator_type local_131;
  double local_130;
  vector<double,_std::allocator<double>_> data;
  vector<double,_std::allocator<double>_> output;
  double local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  _Vector_base<double,_std::allocator<double>_> local_a8;
  _Vector_base<double,_std::allocator<double>_> local_90;
  FC_BPNN bp;
  
  local_e8._8_8_ = local_e8._0_8_;
  iVar6 = 1;
  FC_BPNN::FC_BPNN(&bp,4,10,1);
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  data.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_e8._0_8_ = 0.251;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&data,(double *)local_e8);
  local_e8._0_8_ = 0.425;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&data,(double *)local_e8);
  local_e8._0_8_ = 0.775;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&data,(double *)local_e8);
  local_e8._0_8_ = 0x3fee76c8b4395810;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&data,(double *)local_e8);
  output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  output.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_130 = 0.0;
  while( true ) {
    if (iVar6 == 0x65) break;
    iVar1 = rand();
    iVar2 = rand();
    iVar3 = rand();
    iVar4 = rand();
    auVar9._0_8_ = (double)(iVar1 % 1000);
    auVar9._8_8_ = (double)(iVar2 % 1000);
    local_e8 = divpd(auVar9,_DAT_00105100);
    auVar8._0_8_ = (double)(iVar3 % 1000);
    auVar8._8_8_ = (double)(iVar4 % 1000);
    local_d8 = divpd(auVar8,_DAT_00105100);
    __l._M_len = 4;
    __l._M_array = (iterator)local_e8;
    local_c8 = local_d8;
    local_b8 = local_e8;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_90,__l,&local_131);
    local_f0 = ((double)local_c8._8_8_ +
               (double)local_b8._8_8_ + (double)local_b8._0_8_ + (double)local_c8._0_8_) * 0.25;
    __l_00._M_len = 1;
    __l_00._M_array = &local_f0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_a8,__l_00,&local_132);
    dVar7 = FC_BPNN::train_once(&bp,(vector<double,_std::allocator<double>_> *)&local_90,
                                (vector<double,_std::allocator<double>_> *)&local_a8);
    local_130 = local_130 + dVar7;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a8);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_90);
    if ((char)((char)(((ushort)iVar6 & 0xff) / 10) * -10 + (char)iVar6) == '\0') {
      local_130 = local_130 / 10.0;
      poVar5 = std::operator<<((ostream *)&std::cout,"iter: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar6);
      std::operator<<(poVar5," cost: ");
      poVar5 = std::ostream::_M_insert<double>(local_130);
      std::operator<<(poVar5," step: ");
      dVar7 = FC_BPNN::getLearningStep(&bp);
      poVar5 = std::ostream::_M_insert<double>(dVar7);
      local_130 = 0.0;
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    iVar6 = iVar6 + 1;
  }
  FC_BPNN::predict(&bp,&data,&output);
  std::operator<<((ostream *)&std::cout,"prediction: ");
  poVar5 = std::ostream::_M_insert<double>
                     (*output.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  std::operator<<(poVar5," gt: ");
  poVar5 = std::ostream::_M_insert<double>
                     ((*data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start +
                       data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[1] +
                       data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[2] +
                      data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[3]) * 0.25);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&output.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&data.super__Vector_base<double,_std::allocator<double>_>);
  FC_BPNN::~FC_BPNN(&bp);
  return 1;
}

Assistant:

int main_average() {
	FC_BPNN bp(4, 10, 1);
	std::vector<double> data; data.push_back(0.251); data.push_back(0.425); data.push_back(0.775); data.push_back(0.952);
	std::vector<double> output;
	double lastCost = 0.0; double cost = 0.0;
	for (int i = 1; i <= 100; i++) {
		double a = (double)(rand() % 1000) / 1000;
		double b = (double)(rand() % 1000) / 1000;
		double c = (double)(rand() % 1000) / 1000;
		double d = (double)(rand() % 1000) / 1000;
		cost += bp.train_once({ a ,b, c,d }, { average4(a,b,c,d) });
		if (i % 10 == 0) {
			cost /= 10;
			std::cout << "iter: " << i << " cost: " << cost << " step: " << bp.getLearningStep() << std::endl;
			lastCost = cost;
			cost = 0.0;
		}
	}
	bp.predict(data, output);
	std::cout << "prediction: " << output[0] << " gt: " << average4(data[0], data[1], data[2], data[3]) << std::endl;
	return 1;
}